

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::
ReadLinearExpr<TestNLHandler2::LinearExprHandler>(void *param_1,uint param_2)

{
  int iVar1;
  double dVar2;
  double coef;
  int var_index;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int local_18;
  LinearExprHandler local_1;
  
  for (local_18 = 0; local_18 < (int)param_2; local_18 = local_18 + 1) {
    iVar1 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)param_1,
                     param_2);
    dVar2 = TextReader<fmt::Locale>::ReadDouble
                      ((TextReader<fmt::Locale> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    TextReader<fmt::Locale>::ReadTillEndOfLine((TextReader<fmt::Locale> *)param_1);
    TestNLHandler2::LinearExprHandler::AddTerm(&local_1,iVar1,dVar2);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}